

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O3

void __thiscall
HEkkPrimal::shiftBound
          (HEkkPrimal *this,bool lower,HighsInt iVar,double value,double random_value,double *bound,
          double *shift)

{
  double dVar1;
  undefined7 in_register_00000031;
  undefined8 in_R9;
  double dVar2;
  double dVar3;
  double dVar4;
  string type;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  dVar2 = (random_value + 1.0) * this->primal_feasibility_tolerance;
  dVar1 = *bound;
  local_40 = 0;
  local_38[0] = 0;
  local_48 = local_38;
  if ((int)CONCAT71(in_register_00000031,lower) == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x3d6b0d);
    dVar3 = value - *bound;
    *shift = dVar2 + dVar3;
    dVar4 = dVar2 + dVar3 + *bound;
    *bound = dVar4;
    dVar4 = value - dVar4;
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x3d6b28);
    dVar3 = *bound - value;
    *shift = dVar2 + dVar3;
    dVar4 = *bound - (dVar2 + dVar3);
    *bound = dVar4;
    dVar4 = dVar4 - value;
  }
  if (0.0 < dVar4) {
    highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kInfo,
                "HEkkPrimal::shiftBound Value(%4d) = %10.4g exceeds %s: random_value = %g; value = %g; feasibility = %g; infeasibility = %g; shift = %g; bound = %g; new_infeasibility = %g with error %g\n"
                ,value,dVar1,random_value,value,dVar2,dVar3,*shift,(ulong)(uint)iVar,local_48,in_R9,
                dVar4,ABS(dVar2 + dVar4));
    fflush(_stdout);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void HEkkPrimal::shiftBound(const bool lower, const HighsInt iVar,
                            const double value, const double random_value,
                            double& bound, double& shift) {
  // If infeasibility is very large, then adding feasibility may not
  // yield a new value (see #1144) so new_infeasibility < 0 is false,
  // tripping the old assert
  //
  // Ambros proposed adding feasibility
  // *(infeasibility/scale_threshold) when
  // infeasibility/scale_threshold > 1, but this could lead to a large
  // value for new_infeasibility. Sounds better to accept degeneracy
  // in this edge case.
  double feasibility = (1 + random_value) * primal_feasibility_tolerance;
  double old_bound = bound;
  std::string type;
  double infeasibility;
  double new_infeasibility;
  if (lower) {
    // Bound to shift is lower
    type = "lower";
    assert(value < bound - primal_feasibility_tolerance);
    infeasibility = bound - value;
    assert(infeasibility > 0);
    // Determine the amount by which value will be feasible - so that
    // (ideally) it's not degenerate
    shift = infeasibility + feasibility;
    bound -= shift;
    new_infeasibility = bound - value;
  } else {
    // Bound to shift is upper
    type = "upper";
    assert(value > bound + primal_feasibility_tolerance);
    infeasibility = value - bound;
    assert(infeasibility > 0);
    // Determine the amount by which value will be feasible - so that
    // (ideally) it's not degenerate
    shift = infeasibility + feasibility;
    bound += shift;
    new_infeasibility = value - bound;
  }
  if (new_infeasibility > 0) {
    // new_infeasibility should be non-positive, and negative unless
    // bound is excessively large, whereas feasibility is positive
    double error = std::fabs(new_infeasibility + feasibility);
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "HEkkPrimal::shiftBound Value(%4d) = %10.4g exceeds %s: "
                "random_value = %g; value = %g; "
                "feasibility = %g; infeasibility = %g; shift = %g; bound = %g; "
                "new_infeasibility = %g with error %g\n",
                int(iVar), value, type.c_str(), old_bound, random_value, value,
                feasibility, infeasibility, shift, bound, new_infeasibility,
                error);
    fflush(stdout);
  }
  assert(new_infeasibility <= 0);
}